

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRelaxNGGrammarPtr_conflict xmlRelaxNGNewGrammar(xmlRelaxNGParserCtxtPtr ctxt)

{
  xmlRelaxNGGrammarPtr_conflict pxVar1;
  
  pxVar1 = (xmlRelaxNGGrammarPtr_conflict)(*xmlMalloc)(0x40);
  if (pxVar1 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
    xmlRngPErrMemory(ctxt,(char *)0x0);
  }
  else {
    pxVar1->defs = (xmlHashTablePtr)0x0;
    pxVar1->refs = (xmlHashTablePtr)0x0;
    *(undefined8 *)&pxVar1->combine = 0;
    pxVar1->startList = (xmlRelaxNGDefinePtr_conflict)0x0;
    pxVar1->next = (xmlRelaxNGGrammarPtr)0x0;
    pxVar1->start = (xmlRelaxNGDefinePtr_conflict)0x0;
    pxVar1->parent = (xmlRelaxNGGrammarPtr)0x0;
    pxVar1->children = (xmlRelaxNGGrammarPtr)0x0;
  }
  return pxVar1;
}

Assistant:

static xmlRelaxNGGrammarPtr
xmlRelaxNGNewGrammar(xmlRelaxNGParserCtxtPtr ctxt)
{
    xmlRelaxNGGrammarPtr ret;

    ret = (xmlRelaxNGGrammarPtr) xmlMalloc(sizeof(xmlRelaxNGGrammar));
    if (ret == NULL) {
        xmlRngPErrMemory(ctxt, NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGGrammar));

    return (ret);
}